

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_extension.cpp
# Opt level: O2

int __thiscall
mwheel::test::PluginExtension::clone
          (PluginExtension *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<mwheel::test::PluginExtension>();
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)this = local_18;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->m_int = _Var1._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  return (int)this;
}

Assistant:

ClientInterface::clone_type PluginExtension::clone() { return make_shared<PluginExtension>(); }